

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O1

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test::
testBody(TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MyTypeForTesting object;
  MockFunctionComparator comparator;
  MockExpectedCallsDidntHappenFailure failure;
  MockFailureReporterInstaller local_f1;
  SimpleString local_f0;
  MockExpectedCallsList local_e0;
  SimpleString local_d0;
  undefined **local_c0;
  undefined8 *local_b8;
  SimpleString local_b0;
  SimpleString local_a0;
  undefined **local_90;
  code *local_88;
  code *local_80;
  TestFailure local_78;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_f1);
  local_c0 = &PTR__MyTypeForTesting_002b3450;
  local_b8 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_b8 = 5;
  local_90 = &PTR__MockNamedValueComparator_002b3930;
  local_88 = myTypeIsEqual;
  local_80 = myTypeValueToString;
  SimpleString::SimpleString((SimpleString *)&local_78,"");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_e0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_e0,&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_e0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  MockExpectedCallsList::MockExpectedCallsList(&local_e0);
  local_e0._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aaff0;
  SimpleString::SimpleString((SimpleString *)&local_78,"function");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_e0,(SimpleString *)&local_78);
  SimpleString::SimpleString(&local_f0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_d0,"parameterName");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar3,&local_f0,&local_d0,&local_c0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  test = UtestShell::getCurrent();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)&local_78,test,&local_e0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_d0);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_b0,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_a0,&local_b0,&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_f0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x9f);
  TestFailure::~TestFailure(&local_78);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_e0);
  local_c0 = &PTR__MyTypeForTesting_002b3450;
  if (local_b8 != (undefined8 *)0x0) {
    operator_delete(local_b8,8);
  }
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_f1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparatorThatFailsCoversValueToString)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(5);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("function")->withParameterOfType("MyTypeForTesting", "parameterName", &object);
    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), expectations);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE_LOCATION(failure, __FILE__, __LINE__);
}